

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O1

void joypad_truncate_to(JoypadBuffer *buffer,JoypadStateIter iter)

{
  byte bVar1;
  JoypadBuffer *pJVar2;
  JoypadBuffer *__ptr;
  JoypadChunk *pJVar3;
  
  pJVar3 = iter.chunk;
  pJVar3->size = ((long)iter.state - (long)pJVar3->data >> 4) + 1;
  __ptr = (JoypadBuffer *)pJVar3->next;
  while (__ptr != buffer) {
    pJVar2 = (JoypadBuffer *)(__ptr->sentinel).next;
    free((__ptr->sentinel).data);
    free(__ptr);
    __ptr = pJVar2;
  }
  pJVar3->next = &buffer->sentinel;
  (buffer->sentinel).prev = pJVar3;
  bVar1 = (iter.state)->buttons;
  (buffer->last_buttons).down = (uint)(bVar1 >> 7);
  (buffer->last_buttons).up = bVar1 >> 6 & TRUE;
  (buffer->last_buttons).left = bVar1 >> 5 & TRUE;
  (buffer->last_buttons).right = bVar1 >> 4 & TRUE;
  (buffer->last_buttons).start = bVar1 >> 3 & TRUE;
  (buffer->last_buttons).select = bVar1 >> 2 & TRUE;
  (buffer->last_buttons).B = bVar1 >> 1 & TRUE;
  (buffer->last_buttons).A = bVar1 & TRUE;
  return;
}

Assistant:

void joypad_truncate_to(JoypadBuffer* buffer, JoypadStateIter iter) {
  size_t index = iter.state - iter.chunk->data;
  iter.chunk->size = index + 1;
  JoypadChunk* chunk = iter.chunk->next;
  JoypadChunk* sentinel = &buffer->sentinel;
  while (chunk != sentinel) {
    JoypadChunk* temp = chunk->next;
    xfree(chunk->data);
    xfree(chunk);
    chunk = temp;
  }
  iter.chunk->next = sentinel;
  sentinel->prev = iter.chunk;
  buffer->last_buttons = joypad_unpack_buttons(iter.state->buttons);
}